

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_verify_chain
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_ca_cb_t f_ca_cb,void *p_ca_cb,mbedtls_x509_crt_profile *profile,
              mbedtls_x509_crt_verify_chain *ver_chain,mbedtls_x509_crt_restart_ctx *rs_ctx)

{
  int iVar1;
  undefined1 local_98 [8];
  mbedtls_x509_time now;
  mbedtls_x509_crt *cur_trust_ca;
  uint self_cnt;
  int signature_is_good;
  int child_is_trusted;
  int parent_is_trusted;
  mbedtls_x509_crt *parent;
  mbedtls_x509_crt *child;
  mbedtls_x509_crt_verify_chain_item *cur;
  uint32_t *flags;
  mbedtls_x509_crt_profile *pmStack_40;
  int ret;
  mbedtls_x509_crt_profile *profile_local;
  void *p_ca_cb_local;
  mbedtls_x509_crt_ca_cb_t f_ca_cb_local;
  mbedtls_x509_crl *ca_crl_local;
  mbedtls_x509_crt *trust_ca_local;
  mbedtls_x509_crt *crt_local;
  
  flags._4_4_ = -0x6e;
  now.min = 0;
  now.sec = 0;
  cur_trust_ca._0_4_ = 0;
  signature_is_good = 0;
  parent = crt;
  pmStack_40 = profile;
  profile_local = (mbedtls_x509_crt_profile *)p_ca_cb;
  p_ca_cb_local = f_ca_cb;
  f_ca_cb_local = (mbedtls_x509_crt_ca_cb_t)ca_crl;
  ca_crl_local = (mbedtls_x509_crl *)trust_ca;
  trust_ca_local = crt;
  while( true ) {
    child = (mbedtls_x509_crt *)(ver_chain->items + ver_chain->len);
    *(mbedtls_x509_crt **)child = parent;
    (child->raw).tag = 0;
    ver_chain->len = ver_chain->len + 1;
    cur = (mbedtls_x509_crt_verify_chain_item *)&child->raw;
    if (signature_is_good != 0) {
      return 0;
    }
    self_cnt = signature_is_good;
    iVar1 = x509_profile_check_md_alg(pmStack_40,parent->sig_md);
    if (iVar1 != 0) {
      *(uint *)&cur->crt = *(uint *)&cur->crt | 0x4000;
    }
    iVar1 = x509_profile_check_pk_alg(pmStack_40,parent->sig_pk);
    if (iVar1 != 0) {
      *(uint *)&cur->crt = *(uint *)&cur->crt | 0x8000;
    }
    if ((ver_chain->len == 1) &&
       (iVar1 = x509_crt_check_ee_locally_trusted(parent,(mbedtls_x509_crt *)ca_crl_local),
       iVar1 == 0)) {
      return 0;
    }
    now._16_8_ = ca_crl_local;
    flags._4_4_ = x509_crt_find_parent
                            (parent,(mbedtls_x509_crt *)ca_crl_local,
                             (mbedtls_x509_crt **)&child_is_trusted,&signature_is_good,
                             (int *)((long)&cur_trust_ca + 4),ver_chain->len - 1,(uint)cur_trust_ca,
                             rs_ctx,(mbedtls_x509_time *)local_98);
    if (_child_is_trusted == (mbedtls_x509_crt *)0x0) {
      *(uint *)&cur->crt = *(uint *)&cur->crt | 8;
      return 0;
    }
    if ((ver_chain->len != 1) &&
       (iVar1 = x509_name_cmp(&parent->issuer,&parent->subject), iVar1 == 0)) {
      cur_trust_ca._0_4_ = (uint)cur_trust_ca + 1;
    }
    if ((signature_is_good == 0) && (8 < ver_chain->len)) break;
    if (cur_trust_ca._4_4_ == 0) {
      *(uint *)&cur->crt = *(uint *)&cur->crt | 8;
    }
    iVar1 = x509_profile_check_key(pmStack_40,&_child_is_trusted->pk);
    if (iVar1 != 0) {
      *(uint *)&cur->crt = *(uint *)&cur->crt | 0x10000;
    }
    parent = _child_is_trusted;
    _child_is_trusted = (mbedtls_x509_crt *)0x0;
    cur_trust_ca._4_4_ = 0;
  }
  return -0x3000;
}

Assistant:

static int x509_crt_verify_chain(
    mbedtls_x509_crt *crt,
    mbedtls_x509_crt *trust_ca,
    mbedtls_x509_crl *ca_crl,
    mbedtls_x509_crt_ca_cb_t f_ca_cb,
    void *p_ca_cb,
    const mbedtls_x509_crt_profile *profile,
    mbedtls_x509_crt_verify_chain *ver_chain,
    mbedtls_x509_crt_restart_ctx *rs_ctx)
{
    /* Don't initialize any of those variables here, so that the compiler can
     * catch potential issues with jumping ahead when restarting */
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t *flags;
    mbedtls_x509_crt_verify_chain_item *cur;
    mbedtls_x509_crt *child;
    mbedtls_x509_crt *parent;
    int parent_is_trusted;
    int child_is_trusted;
    int signature_is_good;
    unsigned self_cnt;
    mbedtls_x509_crt *cur_trust_ca = NULL;
    mbedtls_x509_time now;

#if defined(MBEDTLS_HAVE_TIME_DATE)
    if (mbedtls_x509_time_gmtime(mbedtls_time(NULL), &now) != 0) {
        return MBEDTLS_ERR_X509_FATAL_ERROR;
    }
#endif

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    /* resume if we had an operation in progress */
    if (rs_ctx != NULL && rs_ctx->in_progress == x509_crt_rs_find_parent) {
        /* restore saved state */
        *ver_chain = rs_ctx->ver_chain; /* struct copy */
        self_cnt = rs_ctx->self_cnt;

        /* restore derived state */
        cur = &ver_chain->items[ver_chain->len - 1];
        child = cur->crt;
        flags = &cur->flags;

        goto find_parent;
    }
#endif /* MBEDTLS_ECDSA_C && MBEDTLS_ECP_RESTARTABLE */

    child = crt;
    self_cnt = 0;
    parent_is_trusted = 0;
    child_is_trusted = 0;

    while (1) {
        /* Add certificate to the verification chain */
        cur = &ver_chain->items[ver_chain->len];
        cur->crt = child;
        cur->flags = 0;
        ver_chain->len++;
        flags = &cur->flags;

#if defined(MBEDTLS_HAVE_TIME_DATE)
        /* Check time-validity (all certificates) */
        if (mbedtls_x509_time_cmp(&child->valid_to, &now) < 0) {
            *flags |= MBEDTLS_X509_BADCERT_EXPIRED;
        }

        if (mbedtls_x509_time_cmp(&child->valid_from, &now) > 0) {
            *flags |= MBEDTLS_X509_BADCERT_FUTURE;
        }
#endif

        /* Stop here for trusted roots (but not for trusted EE certs) */
        if (child_is_trusted) {
            return 0;
        }

        /* Check signature algorithm: MD & PK algs */
        if (x509_profile_check_md_alg(profile, child->sig_md) != 0) {
            *flags |= MBEDTLS_X509_BADCERT_BAD_MD;
        }

        if (x509_profile_check_pk_alg(profile, child->sig_pk) != 0) {
            *flags |= MBEDTLS_X509_BADCERT_BAD_PK;
        }

        /* Special case: EE certs that are locally trusted */
        if (ver_chain->len == 1 &&
            x509_crt_check_ee_locally_trusted(child, trust_ca) == 0) {
            return 0;
        }

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
find_parent:
#endif

        /* Obtain list of potential trusted signers from CA callback,
         * or use statically provided list. */
#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
        if (f_ca_cb != NULL) {
            mbedtls_x509_crt_free(ver_chain->trust_ca_cb_result);
            mbedtls_free(ver_chain->trust_ca_cb_result);
            ver_chain->trust_ca_cb_result = NULL;

            ret = f_ca_cb(p_ca_cb, child, &ver_chain->trust_ca_cb_result);
            if (ret != 0) {
                return MBEDTLS_ERR_X509_FATAL_ERROR;
            }

            cur_trust_ca = ver_chain->trust_ca_cb_result;
        } else
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */
        {
            ((void) f_ca_cb);
            ((void) p_ca_cb);
            cur_trust_ca = trust_ca;
        }

        /* Look for a parent in trusted CAs or up the chain */
        ret = x509_crt_find_parent(child, cur_trust_ca, &parent,
                                   &parent_is_trusted, &signature_is_good,
                                   ver_chain->len - 1, self_cnt, rs_ctx,
                                   &now);

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
        if (rs_ctx != NULL && ret == MBEDTLS_ERR_ECP_IN_PROGRESS) {
            /* save state */
            rs_ctx->in_progress = x509_crt_rs_find_parent;
            rs_ctx->self_cnt = self_cnt;
            rs_ctx->ver_chain = *ver_chain; /* struct copy */

            return ret;
        }
#else
        (void) ret;
#endif

        /* No parent? We're done here */
        if (parent == NULL) {
            *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
            return 0;
        }

        /* Count intermediate self-issued (not necessarily self-signed) certs.
         * These can occur with some strategies for key rollover, see [SIRO],
         * and should be excluded from max_pathlen checks. */
        if (ver_chain->len != 1 &&
            x509_name_cmp(&child->issuer, &child->subject) == 0) {
            self_cnt++;
        }

        /* path_cnt is 0 for the first intermediate CA,
         * and if parent is trusted it's not an intermediate CA */
        if (!parent_is_trusted &&
            ver_chain->len > MBEDTLS_X509_MAX_INTERMEDIATE_CA) {
            /* return immediately to avoid overflow the chain array */
            return MBEDTLS_ERR_X509_FATAL_ERROR;
        }

        /* signature was checked while searching parent */
        if (!signature_is_good) {
            *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        }

        /* check size of signing key */
        if (x509_profile_check_key(profile, &parent->pk) != 0) {
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
        }

#if defined(MBEDTLS_X509_CRL_PARSE_C)
        /* Check trusted CA's CRL for the given crt */
        *flags |= x509_crt_verifycrl(child, parent, ca_crl, profile, &now);
#else
        (void) ca_crl;
#endif

        /* prepare for next iteration */
        child = parent;
        parent = NULL;
        child_is_trusted = parent_is_trusted;
        signature_is_good = 0;
    }
}